

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffm_score.cc
# Opt level: O0

void __thiscall
xLearn::FFMScore::calc_grad_sgd(FFMScore *this,SparseRow *row,Model *model,real_t pg,real_t norm)

{
  uint uVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  index_t iVar7;
  pointer pNVar8;
  Model *in_RDX;
  long in_RDI;
  float in_XMM0_Da;
  real_t rVar9;
  real_t rVar10;
  float fVar11;
  double dVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float in_XMM1_Da;
  undefined1 auVar16 [16];
  __m128 XMMg2;
  __m128 XMMg1;
  __m128 XMMw2;
  __m128 XMMw1;
  real_t *w2;
  real_t *w1;
  index_t d;
  __m128 XMMpgv;
  __m128 XMMv;
  real_t *w2_base;
  real_t *w1_base;
  real_t v2;
  index_t f2;
  index_t j2;
  const_iterator iter_j;
  real_t v1;
  index_t f1;
  index_t j1;
  const_iterator iter_i;
  __m128 XMMlamb;
  __m128 XMMlr;
  __m128 XMMpg;
  index_t align;
  index_t align1;
  index_t align0;
  real_t g;
  real_t *wb;
  real_t g_1;
  real_t *wl;
  index_t feat_id;
  const_iterator iter;
  index_t num_field;
  index_t num_feat;
  real_t *w;
  real_t sqrt_norm;
  vector<xLearn::Node,_std::allocator<xLearn::Node>_> *in_stack_fffffffffffffc38;
  undefined4 in_stack_fffffffffffffc40;
  float in_stack_fffffffffffffc44;
  real_t in_stack_fffffffffffffc48;
  uint in_stack_fffffffffffffc4c;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  uint local_34c;
  __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
  local_300;
  real_t local_2f4;
  uint local_2f0;
  uint local_2ec;
  Node *local_2e8;
  __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
  local_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  int local_2a0;
  int local_29c;
  uint local_298;
  float local_294;
  real_t *local_290;
  uint local_284;
  real_t *local_280;
  uint local_274;
  Node *local_270;
  __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
  local_268;
  index_t local_260;
  index_t local_25c;
  real_t *local_258;
  float local_24c;
  float local_248;
  float local_244;
  Model *local_240;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  float local_20c;
  undefined4 local_208;
  undefined4 uStack_204;
  undefined4 uStack_200;
  undefined4 uStack_1fc;
  undefined4 local_1ec;
  undefined4 local_1e8;
  undefined4 uStack_1e4;
  undefined4 uStack_1e0;
  undefined4 uStack_1dc;
  undefined4 local_1cc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1ac;
  undefined1 (*local_1a8) [16];
  undefined1 (*local_1a0) [16];
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined1 local_148 [16];
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined1 (*local_20) [16];
  undefined8 local_18;
  undefined8 uStack_10;
  undefined1 (*local_8) [16];
  
  local_248 = in_XMM1_Da;
  local_244 = in_XMM0_Da;
  local_240 = in_RDX;
  dVar12 = std::sqrt((double)(ulong)(uint)in_XMM1_Da);
  local_24c = SUB84(dVar12,0);
  local_258 = Model::GetParameter_w(local_240);
  local_25c = Model::GetNumFeature(local_240);
  local_260 = Model::GetNumField(local_240);
  local_268._M_current =
       (Node *)std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::begin
                         (in_stack_fffffffffffffc38);
  while( true ) {
    local_270 = (Node *)std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::end
                                  (in_stack_fffffffffffffc38);
    bVar6 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                        *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                       (__normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                        *)in_stack_fffffffffffffc38);
    if (!bVar6) break;
    pNVar8 = __gnu_cxx::
             __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
             ::operator->(&local_268);
    local_274 = pNVar8->feat_id;
    if (local_274 < local_25c) {
      local_280 = local_258 + local_274;
      in_stack_fffffffffffffc4c = *(uint *)(in_RDI + 0xc);
      in_stack_fffffffffffffc48 = *local_280;
      in_stack_fffffffffffffc44 = local_244;
      pNVar8 = __gnu_cxx::
               __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
               ::operator->(&local_268);
      auVar3 = vfmadd213ss_fma(ZEXT416((uint)in_stack_fffffffffffffc48),
                               ZEXT416(in_stack_fffffffffffffc4c),
                               ZEXT416((uint)(in_stack_fffffffffffffc44 * pNVar8->feat_val *
                                             local_24c)));
      local_284 = auVar3._0_4_;
      auVar3 = vfmadd213ss_fma(ZEXT416(local_284),ZEXT416(*(uint *)(in_RDI + 8) ^ 0x80000000),
                               ZEXT416((uint)*local_280));
      *local_280 = auVar3._0_4_;
    }
    __gnu_cxx::
    __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
    ::operator++(&local_268);
  }
  local_290 = Model::GetParameter_b(local_240);
  local_294 = local_244;
  auVar16 = ZEXT416(*(uint *)(in_RDI + 8));
  auVar3 = vfnmadd213ss_fma(ZEXT416((uint)local_244),ZEXT416(*(uint *)(in_RDI + 8)),
                            ZEXT416((uint)*local_290));
  *local_290 = auVar3._0_4_;
  local_258 = local_290;
  rVar9 = Model::GetAuxiliarySize(local_240);
  iVar7 = Model::get_aligned_k((Model *)0x1b585d);
  auVar3 = vcvtusi2ss_avx512f(auVar16,iVar7);
  local_298 = vcvttss2usi_avx512f(ZEXT416((uint)(rVar9 * auVar3._0_4_)));
  iVar7 = Model::GetNumField(local_240);
  local_29c = iVar7 * local_298;
  rVar10 = Model::GetAuxiliarySize(local_240);
  local_2a0 = vcvttss2usi_avx512f(ZEXT416((uint)(rVar10 * 4.0)));
  local_258 = Model::GetParameter_v(local_240);
  local_1ac = local_244;
  local_1c8 = local_244;
  fStack_1c4 = local_244;
  fStack_1c0 = local_244;
  fStack_1bc = local_244;
  local_2b8 = CONCAT44(local_244,local_244);
  uStack_2b0 = CONCAT44(local_244,local_244);
  local_1e8 = *(undefined4 *)(in_RDI + 8);
  local_2c8 = CONCAT44(local_1e8,local_1e8);
  uStack_2c0 = CONCAT44(local_1e8,local_1e8);
  local_208 = *(undefined4 *)(in_RDI + 0xc);
  local_2d8 = CONCAT44(local_208,local_208);
  uStack_2d0 = CONCAT44(local_208,local_208);
  uStack_204 = local_208;
  uStack_200 = local_208;
  uStack_1fc = local_208;
  local_1ec = local_208;
  uStack_1e4 = local_1e8;
  uStack_1e0 = local_1e8;
  uStack_1dc = local_1e8;
  local_1cc = local_1e8;
  local_2e0._M_current =
       (Node *)std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::begin
                         (in_stack_fffffffffffffc38);
  while( true ) {
    local_2e8 = (Node *)std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::end
                                  (in_stack_fffffffffffffc38);
    bVar6 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                        *)CONCAT44(in_stack_fffffffffffffc44,rVar9),
                       (__normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                        *)in_stack_fffffffffffffc38);
    if (!bVar6) break;
    pNVar8 = __gnu_cxx::
             __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
             ::operator->(&local_2e0);
    local_2ec = pNVar8->feat_id;
    pNVar8 = __gnu_cxx::
             __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
             ::operator->(&local_2e0);
    local_2f0 = pNVar8->field_id;
    if ((local_2ec < local_25c) && (local_2f0 < local_260)) {
      pNVar8 = __gnu_cxx::
               __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
               ::operator->(&local_2e0);
      local_2f4 = pNVar8->feat_val;
      local_300 = __gnu_cxx::
                  __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                  ::operator+((__normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                               *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
                              CONCAT44(in_stack_fffffffffffffc44,rVar9));
      while( true ) {
        std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::end(in_stack_fffffffffffffc38);
        bVar6 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                            *)CONCAT44(in_stack_fffffffffffffc44,rVar9),
                           (__normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                            *)in_stack_fffffffffffffc38);
        if (!bVar6) break;
        pNVar8 = __gnu_cxx::
                 __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                 ::operator->(&local_300);
        uVar1 = pNVar8->feat_id;
        pNVar8 = __gnu_cxx::
                 __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                 ::operator->(&local_300);
        uVar2 = pNVar8->field_id;
        if ((uVar1 < local_25c) && (uVar2 < local_260)) {
          pNVar8 = __gnu_cxx::
                   __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                   ::operator->(&local_300);
          local_228 = local_2f4 * pNVar8->feat_val * local_248;
          local_88 = CONCAT44(local_228,local_228);
          uStack_80 = CONCAT44(local_228,local_228);
          local_98 = local_2b8;
          uVar4 = local_98;
          uStack_90 = uStack_2b0;
          uVar5 = uStack_90;
          local_98._0_4_ = (float)local_2b8;
          local_98._4_4_ = (float)((ulong)local_2b8 >> 0x20);
          uStack_90._0_4_ = (float)uStack_2b0;
          uStack_90._4_4_ = (float)((ulong)uStack_2b0 >> 0x20);
          fVar11 = local_228 * (float)local_98;
          fVar13 = local_228 * local_98._4_4_;
          fVar14 = local_228 * (float)uStack_90;
          fVar15 = local_228 * uStack_90._4_4_;
          for (local_34c = 0; fStack_224 = local_228, fStack_220 = local_228, fStack_21c = local_228
              , local_20c = local_228, local_98 = uVar4, uStack_90 = uVar5, local_34c < local_298;
              local_34c = local_2a0 + local_34c) {
            local_1a0 = (undefined1 (*) [16])
                        (local_258 +
                        (ulong)(local_2ec * local_29c) +
                        (ulong)(uVar2 * local_298) + (ulong)local_34c);
            local_1a8 = (undefined1 (*) [16])
                        (local_258 +
                        (ulong)(uVar1 * local_29c) +
                        (ulong)(local_2f0 * local_298) + (ulong)local_34c);
            local_118 = *(undefined8 *)*local_1a0;
            uStack_110 = *(undefined8 *)(*local_1a0 + 8);
            local_f8 = *(undefined8 *)*local_1a8;
            uStack_f0 = *(undefined8 *)(*local_1a8 + 8);
            local_a8._0_4_ = (float)local_2d8;
            local_a8._4_4_ = (float)((ulong)local_2d8 >> 0x20);
            uStack_a0._0_4_ = (float)uStack_2d0;
            uStack_a0._4_4_ = (float)((ulong)uStack_2d0 >> 0x20);
            local_b8._0_4_ = (float)local_118;
            local_b8._4_4_ = (float)((ulong)local_118 >> 0x20);
            uStack_b0._0_4_ = (float)uStack_110;
            uStack_b0._4_4_ = (float)((ulong)uStack_110 >> 0x20);
            local_168 = (float)local_a8 * (float)local_b8;
            fStack_164 = local_a8._4_4_ * local_b8._4_4_;
            fStack_160 = (float)uStack_a0 * (float)uStack_b0;
            fStack_15c = uStack_a0._4_4_ * uStack_b0._4_4_;
            local_c8 = CONCAT44(fVar13,fVar11);
            uStack_c0 = CONCAT44(fVar15,fVar14);
            local_d8._0_4_ = (float)local_f8;
            local_d8._4_4_ = (float)((ulong)local_f8 >> 0x20);
            uStack_d0._0_4_ = (float)uStack_f0;
            uStack_d0._4_4_ = (float)((ulong)uStack_f0 >> 0x20);
            local_178 = fVar11 * (float)local_d8;
            fStack_174 = fVar13 * local_d8._4_4_;
            fStack_170 = fVar14 * (float)uStack_d0;
            fStack_16c = fVar15 * uStack_d0._4_4_;
            local_e8 = local_2d8;
            uStack_e0 = uStack_2d0;
            local_188 = (float)local_a8 * (float)local_d8;
            fStack_184 = local_a8._4_4_ * local_d8._4_4_;
            fStack_180 = (float)uStack_a0 * (float)uStack_d0;
            fStack_17c = uStack_a0._4_4_ * uStack_d0._4_4_;
            local_108 = CONCAT44(fVar13,fVar11);
            uStack_100 = CONCAT44(fVar15,fVar14);
            local_198 = fVar11 * (float)local_b8;
            fStack_194 = fVar13 * local_b8._4_4_;
            fStack_190 = fVar14 * (float)uStack_b0;
            fStack_18c = fVar15 * uStack_b0._4_4_;
            local_138 = CONCAT44(fStack_164 + fStack_174,local_168 + local_178);
            uStack_130 = CONCAT44(fStack_15c + fStack_16c,fStack_160 + fStack_170);
            local_128._0_4_ = (float)local_2c8;
            local_128._4_4_ = (float)((ulong)local_2c8 >> 0x20);
            uStack_120._0_4_ = (float)uStack_2c0;
            uStack_120._4_4_ = (float)((ulong)uStack_2c0 >> 0x20);
            local_58 = (float)local_128 * (local_168 + local_178);
            fStack_54 = local_128._4_4_ * (fStack_164 + fStack_174);
            fStack_50 = (float)uStack_120 * (fStack_160 + fStack_170);
            fStack_4c = uStack_120._4_4_ * (fStack_15c + fStack_16c);
            auVar3._4_4_ = fStack_54;
            auVar3._0_4_ = local_58;
            auVar3._8_4_ = fStack_50;
            auVar3._12_4_ = fStack_4c;
            auVar3 = vsubps_avx(*local_1a0,auVar3);
            local_148._8_8_ = uStack_2c0;
            local_148._0_8_ = local_2c8;
            local_158 = CONCAT44(fStack_184 + fStack_194,local_188 + local_198);
            uStack_150 = CONCAT44(fStack_17c + fStack_18c,fStack_180 + fStack_190);
            local_78 = (float)local_128 * (local_188 + local_198);
            fStack_74 = local_128._4_4_ * (fStack_184 + fStack_194);
            fStack_70 = (float)uStack_120 * (fStack_180 + fStack_190);
            fStack_6c = uStack_120._4_4_ * (fStack_17c + fStack_18c);
            auVar16._4_4_ = fStack_74;
            auVar16._0_4_ = local_78;
            auVar16._8_4_ = fStack_70;
            auVar16._12_4_ = fStack_6c;
            auVar16 = vsubps_avx(*local_1a8,auVar16);
            local_378 = auVar3._0_8_;
            local_18 = local_378;
            uStack_370 = auVar3._8_8_;
            uStack_10 = uStack_370;
            *(undefined8 *)*local_1a0 = local_378;
            *(undefined8 *)(*local_1a0 + 8) = uStack_370;
            local_388 = auVar16._0_8_;
            local_38 = local_388;
            uStack_380 = auVar16._8_8_;
            uStack_30 = uStack_380;
            *(undefined8 *)*local_1a8 = local_388;
            *(undefined8 *)(*local_1a8 + 8) = uStack_380;
            local_128 = local_2c8;
            uStack_120 = uStack_2c0;
            local_d8 = local_f8;
            uStack_d0 = uStack_f0;
            local_b8 = local_118;
            uStack_b0 = uStack_110;
            local_a8 = local_2d8;
            uStack_a0 = uStack_2d0;
            local_68 = local_f8;
            uStack_60 = uStack_f0;
            local_48 = local_118;
            uStack_40 = uStack_110;
            local_20 = local_1a8;
            local_8 = local_1a0;
          }
        }
        __gnu_cxx::
        __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
        ::operator++(&local_300);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
    ::operator++(&local_2e0);
  }
  return;
}

Assistant:

void FFMScore::calc_grad_sgd(const SparseRow* row,
                             Model& model,
                             real_t pg,
                             real_t norm) {
  /*********************************************************
   *  linear term and bias term                            *
   *********************************************************/
  real_t sqrt_norm = sqrt(norm);
  real_t *w = model.GetParameter_w();
  index_t num_feat = model.GetNumFeature();
  index_t num_field = model.GetNumField();
  for (SparseRow::const_iterator iter = row->begin();
       iter != row->end(); ++iter) {
    index_t feat_id = iter->feat_id;
    // To avoid unseen feature
    if (feat_id >= num_feat) continue;
    real_t &wl = w[feat_id];
    real_t g = regu_lambda_*wl+pg*iter->feat_val*sqrt_norm;
    wl -= (learning_rate_ * g);
  }
  // bias
  w = model.GetParameter_b();
  real_t &wb = w[0];
  real_t g = pg;
  wb -= (learning_rate_ * g);
  /*********************************************************
   *  latent factor                                        *
   *********************************************************/
  index_t align0 = model.GetAuxiliarySize() * model.get_aligned_k();
  index_t align1 = model.GetNumField() * align0;
  index_t align = kAlign * model.GetAuxiliarySize();
  w = model.GetParameter_v();
  __m128 XMMpg = _mm_set1_ps(pg);
  __m128 XMMlr = _mm_set1_ps(learning_rate_);
  __m128 XMMlamb = _mm_set1_ps(regu_lambda_);
  for (SparseRow::const_iterator iter_i = row->begin();
       iter_i != row->end(); ++iter_i) {
    index_t j1 = iter_i->feat_id;
    index_t f1 = iter_i->field_id;
    // To avoid unseen feature
    if (j1 >= num_feat || f1 >= num_field) continue;
    real_t v1 = iter_i->feat_val;
    for (SparseRow::const_iterator iter_j = iter_i+1;
         iter_j != row->end(); ++iter_j) {
      index_t j2 = iter_j->feat_id;
      index_t f2 = iter_j->field_id;
      // To avoid unseen feature
      if (j2 >= num_feat || f2 >= num_field) continue;
      real_t v2 = iter_j->feat_val;
      real_t* w1_base = w + j1*align1 + f2*align0;
      real_t* w2_base = w + j2*align1 + f1*align0;
      __m128 XMMv = _mm_set1_ps(v1*v2*norm);
      __m128 XMMpgv = _mm_mul_ps(XMMv, XMMpg);
      for (index_t d = 0; d < align0; d += align) {
        real_t *w1 = w1_base + d;
        real_t *w2 = w2_base + d;
        __m128 XMMw1 = _mm_load_ps(w1);
        __m128 XMMw2 = _mm_load_ps(w2);
        __m128 XMMg1 = _mm_add_ps(
                       _mm_mul_ps(XMMlamb, XMMw1),
                       _mm_mul_ps(XMMpgv, XMMw2));
        __m128 XMMg2 = _mm_add_ps(
                       _mm_mul_ps(XMMlamb, XMMw2),
                       _mm_mul_ps(XMMpgv, XMMw1));
        XMMw1 = _mm_sub_ps(XMMw1, _mm_mul_ps(XMMlr, XMMg1));
        XMMw2 = _mm_sub_ps(XMMw2, _mm_mul_ps(XMMlr, XMMg2));
        _mm_store_ps(w1, XMMw1);
        _mm_store_ps(w2, XMMw2);
      }
    }
  }

}